

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

void __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
create_spatial_splits
          (HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,PrimInfoExtRange *set,SpatialSplit *split,SpatialBinMapping<16UL> *mapping)

{
  unsigned_long *puVar1;
  int iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  char cVar5;
  runtime_error *this_00;
  float fVar6;
  atomic<unsigned_long> ext_elements;
  size_t max_ext_range_size;
  size_t ext_range_start;
  float fpos;
  anon_class_8_1_898bcfc2 local_f8;
  blocked_range<unsigned_long> local_f0;
  task_group_context context;
  anon_class_48_6_fef31792 local_58;
  
  local_58.ext_elements = &ext_elements;
  uVar3 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  max_ext_range_size = (set->super_extended_range<unsigned_long>)._ext_end - uVar3;
  LOCK();
  ext_elements.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  UNLOCK();
  iVar2 = split->pos;
  if ((long)iVar2 < 0) {
    fVar6 = (float)(ulong)(long)iVar2;
  }
  else {
    fVar6 = (float)iVar2;
  }
  fpos = fVar6 * (split->mapping).inv_scale.field_0.v[split->dim] +
         (split->mapping).ofs.field_0.v[split->dim];
  local_58.fpos = &fpos;
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  local_58.max_ext_range_size = &max_ext_range_size;
  local_58.ext_range_start = &ext_range_start;
  ext_range_start = uVar3;
  local_58.this =
       (HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
        *)this;
  local_58.split = split;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_f0.my_grainsize = 0x40;
  local_f8.func = &local_58;
  local_f0.my_end = uVar3;
  local_f0.my_begin = uVar4;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::create_spatial_splits(embree::sse2::PrimInfoExtRange&,embree::sse2::SpatialBinSplit<16ul>const&,embree::sse2::SpatialBinMapping<16ul>const&)::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,embree::PrimRef,32ul,16ul>::create_spatial_splits(embree::sse2::PrimInfoExtRange&,embree::sse2::SpatialBinSplit<16ul>const&,embree::sse2::SpatialBinMapping<16ul>const&)::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            (&local_f0,&local_f8,&context);
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar5 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    if (max_ext_range_size < (ulong)ext_elements.super___atomic_base<unsigned_long>._M_i) {
      ext_elements.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)max_ext_range_size;
    }
    puVar1 = &(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
    *puVar1 = *puVar1 + (long)ext_elements.super___atomic_base<unsigned_long>._M_i;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline void create_spatial_splits(PrimInfoExtRange& set, const SpatialSplit& split, const SpatialBinMapping<SPATIAL_BINS> &mapping)
        {
          assert(set.has_ext_range());
          const size_t max_ext_range_size = set.ext_range_size();
          const size_t ext_range_start = set.end();

          /* atomic counter for number of primref splits */
          std::atomic<size_t> ext_elements;
          ext_elements.store(0);
          
          const float fpos = split.mapping.pos(split.pos,split.dim);
        
          const unsigned int mask = 0xFFFFFFFF >> RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS;

          parallel_for( set.begin(), set.end(), CREATE_SPLITS_STEP_SIZE, [&](const range<size_t>& r) {
              for (size_t i=r.begin();i<r.end();i++)
              {
                const unsigned int splits = prims0[i].geomID() >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS);

                if (likely(splits <= 1)) continue; /* todo: does this ever happen ? */

                const int bin0 = split.mapping.bin(prims0[i].lower)[split.dim];
                const int bin1 = split.mapping.bin(prims0[i].upper)[split.dim];
                if (unlikely(bin0 < split.pos && bin1 >= split.pos))
                {
                  assert(splits > 1);

                  PrimRef left,right;
                  const auto splitter = splitterFactory(prims0[i]);
                  splitter(prims0[i],split.dim,fpos,left,right);
                
                  // no empty splits
                  if (unlikely(left.bounds().empty() || right.bounds().empty())) continue;
                
                  left.lower.u  = (left.lower.u  & mask) | ((splits-1) << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));
                  right.lower.u = (right.lower.u & mask) | ((splits-1) << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));

                  const size_t ID = ext_elements.fetch_add(1);

                  /* break if the number of subdivided elements are greater than the maximum allowed size */
                  if (unlikely(ID >= max_ext_range_size)) 
                    break;

                  /* only write within the correct bounds */
                  assert(ID < max_ext_range_size);
                  prims0[i] = left;
                  prims0[ext_range_start+ID] = right;     
                }
              }
            });

          const size_t numExtElements = min(max_ext_range_size,ext_elements.load());          
          assert(set.end()+numExtElements<=set.ext_end());
          set._end += numExtElements;
        }